

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dsatur.cpp
# Opt level: O1

void __thiscall Dsatur::assignColor(Dsatur *this,Node *node)

{
  pointer *pppNVar1;
  pointer pvVar2;
  iterator __position;
  pointer ppNVar3;
  uint uVar4;
  pointer ppNVar5;
  bool bVar6;
  uint uVar7;
  Node *local_50;
  vector<Node_*,_std::allocator<Node_*>_> local_48;
  
  local_50 = node;
  if (this->number_of_colors_used < 1) {
    uVar4 = 1;
  }
  else {
    uVar7 = 1;
    do {
      std::vector<Node_*,_std::allocator<Node_*>_>::vector(&local_48,&local_50->neighbors);
      if (local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar6 = true;
      }
      else {
        bVar6 = true;
        ppNVar3 = local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          ppNVar5 = ppNVar3 + 1;
          if ((*ppNVar3)->assignedColor == uVar7) {
            bVar6 = false;
            break;
          }
          ppNVar3 = ppNVar5;
        } while (ppNVar5 !=
                 local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      }
      if (local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar4 = uVar7;
    } while ((!bVar6) &&
            (uVar4 = uVar7 + 1, bVar6 = (int)uVar7 < this->number_of_colors_used, uVar7 = uVar4,
            bVar6));
  }
  local_50->assignedColor = uVar4;
  if (this->number_of_colors_used < (int)uVar4) {
    this->number_of_colors_used = uVar4;
    local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)operator_new(8);
    local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_start + 1;
    *local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
     _M_start = local_50;
    local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    std::
    vector<std::vector<Node*,std::allocator<Node*>>,std::allocator<std::vector<Node*,std::allocator<Node*>>>>
    ::emplace_back<std::vector<Node*,std::allocator<Node*>>>
              ((vector<std::vector<Node*,std::allocator<Node*>>,std::allocator<std::vector<Node*,std::allocator<Node*>>>>
                *)&this->classes,&local_48);
    if (local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    pvVar2 = (this->classes).
             super__Vector_base<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    __position._M_current =
         *(pointer *)
          ((long)&pvVar2[(ulong)uVar4 - 1].super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                  _M_impl.super__Vector_impl_data + 8);
    if (__position._M_current ==
        *(pointer *)
         ((long)&pvVar2[(ulong)uVar4 - 1].super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                 _M_impl.super__Vector_impl_data + 0x10)) {
      std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                ((vector<Node*,std::allocator<Node*>> *)(pvVar2 + ((ulong)uVar4 - 1)),__position,
                 &local_50);
    }
    else {
      *__position._M_current = local_50;
      pppNVar1 = (pointer *)
                 ((long)&pvVar2[(ulong)uVar4 - 1].
                         super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                         super__Vector_impl_data + 8);
      *pppNVar1 = *pppNVar1 + 1;
    }
  }
  return;
}

Assistant:

void Dsatur::assignColor(Node *node) {

    int color = 1;
    for(;color<=number_of_colors_used;color++){
        bool assignIt = true;
        for(auto neighbor:node->getNeighbors()){
            if(neighbor->getAssignedColor()!=-1 && neighbor->getAssignedColor() == color){
                assignIt = false;
                break;
            }
        }

        if(assignIt)
            break;
    }

    node->setAssignedColor(color);

    if(color > number_of_colors_used) {
        number_of_colors_used = color;
        classes.push_back(std::vector<Node*>(1,node));
    }else{
        classes[color-1].push_back(node);
    }

}